

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEvents.cpp
# Opt level: O1

void TTD::NSLogEvents::SnapshotEventLogEntry_Parse
               (EventLogEntry *evt,ThreadContext *threadContext,FileReader *reader,
               UnlinkableSlabAllocator *alloc)

{
  EventKind EVar1;
  int iVar2;
  int64 iVar3;
  unsigned_long *puVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar5;
  
  if (evt->EventKind == SnapshotTag) {
    iVar3 = FileReader::ReadInt64(reader,restoreTime,true);
    evt[1].EventKind = (int)iVar3;
    evt[1].ResultStatus = (int)((ulong)iVar3 >> 0x20);
    EVar1 = FileReader::ReadLengthValue(reader,true);
    evt[2].EventKind = EVar1;
    if (EVar1 == Invalid) {
      puVar4 = (unsigned_long *)0x0;
    }
    else {
      puVar4 = SlabAllocatorBase<8>::SlabAllocateArray<unsigned_long>(alloc,(ulong)EVar1);
    }
    evt[2].EventTimeStamp = (int64)puVar4;
    FileReader::ReadSequenceStart_WDefaultKey(reader,true);
    if (evt[2].EventKind != Invalid) {
      uVar5 = 0;
      do {
        iVar2 = (*reader->_vptr_FileReader[0x11])(reader,(ulong)(uVar5 != 0));
        *(ulong *)(evt[2].EventTimeStamp + uVar5 * 8) = CONCAT44(extraout_var,iVar2);
        uVar5 = uVar5 + 1;
      } while (uVar5 < evt[2].EventKind);
    }
    (*reader->_vptr_FileReader[5])(reader);
    EVar1 = FileReader::ReadLengthValue(reader,true);
    evt[3].EventKind = EVar1;
    if (EVar1 == Invalid) {
      puVar4 = (unsigned_long *)0x0;
    }
    else {
      puVar4 = SlabAllocatorBase<8>::SlabAllocateArray<unsigned_long>(alloc,(ulong)EVar1);
    }
    evt[3].EventTimeStamp = (int64)puVar4;
    FileReader::ReadSequenceStart_WDefaultKey(reader,true);
    if (evt[3].EventKind != Invalid) {
      uVar5 = 0;
      do {
        iVar2 = (*reader->_vptr_FileReader[0x11])(reader,(ulong)(uVar5 != 0));
        *(ulong *)(evt[3].EventTimeStamp + uVar5 * 8) = CONCAT44(extraout_var_00,iVar2);
        uVar5 = uVar5 + 1;
      } while (uVar5 < evt[3].EventKind);
    }
    (*reader->_vptr_FileReader[5])(reader);
    evt[1].EventTimeStamp = 0;
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void SnapshotEventLogEntry_Parse(EventLogEntry* evt, ThreadContext* threadContext, FileReader* reader, UnlinkableSlabAllocator& alloc)
        {
            SnapshotEventLogEntry* snapEvt = GetInlineEventDataAs<SnapshotEventLogEntry, EventKind::SnapshotTag>(evt);

            snapEvt->RestoreTimestamp = reader->ReadInt64(NSTokens::Key::restoreTime, true);

            snapEvt->LiveContextCount = reader->ReadLengthValue(true);
            snapEvt->LiveContextIdArray = (snapEvt->LiveContextCount != 0) ? alloc.SlabAllocateArray<TTD_LOG_PTR_ID>(snapEvt->LiveContextCount) : nullptr;

            reader->ReadSequenceStart_WDefaultKey(true);
            for(uint32 i = 0; i < snapEvt->LiveContextCount; ++i)
            {
                snapEvt->LiveContextIdArray[i] = reader->ReadNakedLogTag(i != 0);
            }
            reader->ReadSequenceEnd();

            snapEvt->LongLivedRefRootsCount = reader->ReadLengthValue(true);
            snapEvt->LongLivedRefRootsIdArray = (snapEvt->LongLivedRefRootsCount != 0) ? alloc.SlabAllocateArray<TTD_LOG_PTR_ID>(snapEvt->LongLivedRefRootsCount) : nullptr;

            reader->ReadSequenceStart_WDefaultKey(true);
            for(uint32 i = 0; i < snapEvt->LongLivedRefRootsCount; ++i)
            {
                snapEvt->LongLivedRefRootsIdArray[i] = reader->ReadNakedLogTag(i != 0);
            }
            reader->ReadSequenceEnd();

            snapEvt->Snap = nullptr;
        }